

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaGetComponentTargetNs(xmlSchemaBasicItemPtr item)

{
  xmlSchemaTypeType xVar1;
  xmlChar *pxVar2;
  xmlSchemaBasicItemPtr item_local;
  
  if (item == (xmlSchemaBasicItemPtr)0x0) {
    item_local = (xmlSchemaBasicItemPtr)0x0;
  }
  else {
    xVar1 = item->type;
    if (xVar1 == XML_SCHEMA_TYPE_BASIC) {
      item_local = (xmlSchemaBasicItemPtr)anon_var_dwarf_510fc;
    }
    else if (xVar1 - XML_SCHEMA_TYPE_SIMPLE < 2) {
      item_local = *(xmlSchemaBasicItemPtr *)(item + 0xd);
    }
    else if (xVar1 == XML_SCHEMA_TYPE_ELEMENT) {
      item_local = *(xmlSchemaBasicItemPtr *)(item + 6);
    }
    else if (xVar1 == XML_SCHEMA_TYPE_ATTRIBUTE) {
      item_local = *(xmlSchemaBasicItemPtr *)(item + 7);
    }
    else if (xVar1 == XML_SCHEMA_TYPE_ATTRIBUTEGROUP) {
      item_local = (xmlSchemaBasicItemPtr)item[6].dummy;
    }
    else if (xVar1 == XML_SCHEMA_TYPE_GROUP) {
      item_local = (xmlSchemaBasicItemPtr)item[2].dummy;
    }
    else if (xVar1 == XML_SCHEMA_TYPE_NOTATION) {
      item_local = *(xmlSchemaBasicItemPtr *)(item + 2);
    }
    else if (xVar1 - XML_SCHEMA_TYPE_IDC_UNIQUE < 3) {
      item_local = (xmlSchemaBasicItemPtr)item[2].dummy;
    }
    else {
      if (xVar1 == XML_SCHEMA_TYPE_ATTRIBUTE_USE) {
        if (item[1].dummy != (void *)0x0) {
          pxVar2 = xmlSchemaGetComponentTargetNs((xmlSchemaBasicItemPtr)item[1].dummy);
          return pxVar2;
        }
      }
      else if (xVar1 == XML_SCHEMA_EXTRA_QNAMEREF) {
        return *(xmlChar **)(item + 2);
      }
      item_local = (xmlSchemaBasicItemPtr)0x0;
    }
  }
  return (xmlChar *)item_local;
}

Assistant:

static const xmlChar *
xmlSchemaGetComponentTargetNs(xmlSchemaBasicItemPtr item)
{
    if (item == NULL) {
        return (NULL);
    }
    switch (item->type) {
	case XML_SCHEMA_TYPE_ELEMENT:
	    return (((xmlSchemaElementPtr) item)->targetNamespace);
	case XML_SCHEMA_TYPE_ATTRIBUTE:
	    return (((xmlSchemaAttributePtr) item)->targetNamespace);
	case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
	    return (((xmlSchemaAttributeGroupPtr) item)->targetNamespace);
	case XML_SCHEMA_TYPE_BASIC:
	    return (BAD_CAST "http://www.w3.org/2001/XMLSchema");
	case XML_SCHEMA_TYPE_SIMPLE:
	case XML_SCHEMA_TYPE_COMPLEX:
	    return (((xmlSchemaTypePtr) item)->targetNamespace);
	case XML_SCHEMA_TYPE_GROUP:
	    return (((xmlSchemaModelGroupDefPtr) item)->targetNamespace);
	case XML_SCHEMA_TYPE_IDC_KEY:
	case XML_SCHEMA_TYPE_IDC_UNIQUE:
	case XML_SCHEMA_TYPE_IDC_KEYREF:
	    return (((xmlSchemaIDCPtr) item)->targetNamespace);
	case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
	    if (WXS_ATTRUSE_DECL(item) != NULL) {
		return(xmlSchemaGetComponentTargetNs(
		    WXS_BASIC_CAST WXS_ATTRUSE_DECL(item)));
	    }
	    /* TODO: Will returning NULL break something? */
	    break;
	case XML_SCHEMA_EXTRA_QNAMEREF:
	    return (((xmlSchemaQNameRefPtr) item)->targetNamespace);
	case XML_SCHEMA_TYPE_NOTATION:
	    return (((xmlSchemaNotationPtr) item)->targetNamespace);
	default:
	    /*
	    * Other components cannot have names.
	    */
	    break;
    }
    return (NULL);
}